

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int get_uri_type(char *uri)

{
  int iVar1;
  ulong port_00;
  unsigned_long port;
  char *portend;
  char *portbegin;
  char *hostend;
  char *pcStack_18;
  int i;
  char *uri_local;
  
  if ((*uri == '*') && (uri[1] == '\0')) {
    uri_local._4_4_ = 1;
  }
  else {
    for (hostend._4_4_ = 0; uri[hostend._4_4_] != '\0'; hostend._4_4_ = hostend._4_4_ + 1) {
      if (uri[hostend._4_4_] < '!') {
        return 0;
      }
    }
    if (*uri == '/') {
      uri_local._4_4_ = 2;
    }
    else {
      hostend._4_4_ = 0;
      pcStack_18 = uri;
      while (abs_uri_protocols[hostend._4_4_].proto != (char *)0x0) {
        iVar1 = mg_strncasecmp(pcStack_18,abs_uri_protocols[hostend._4_4_].proto,
                               abs_uri_protocols[hostend._4_4_].proto_len);
        if (iVar1 == 0) {
          portbegin = strchr(pcStack_18 + abs_uri_protocols[hostend._4_4_].proto_len,0x2f);
          if (portbegin == (char *)0x0) {
            return 0;
          }
          portend = strchr(pcStack_18 + abs_uri_protocols[hostend._4_4_].proto_len,0x3a);
          if (portend != (char *)0x0) {
            port_00 = strtoul(portend + 1,(char **)&port,10);
            if ((((char *)port == portbegin) && (port_00 != 0)) &&
               (iVar1 = is_valid_port(port_00), iVar1 != 0)) {
              return 4;
            }
            return 0;
          }
          return 3;
        }
        hostend._4_4_ = hostend._4_4_ + 1;
      }
      uri_local._4_4_ = 0;
    }
  }
  return uri_local._4_4_;
}

Assistant:

static int
get_uri_type(const char *uri)
{
	int i;
	const char *hostend, *portbegin;
	char *portend;
	unsigned long port;

	/* According to the HTTP standard
	 * http://www.w3.org/Protocols/rfc2616/rfc2616-sec5.html#sec5.1.2
	 * URI can be an asterisk (*) or should start with slash (relative uri),
	 * or it should start with the protocol (absolute uri). */
	if ((uri[0] == '*') && (uri[1] == '\0')) {
		/* asterisk */
		return 1;
	}

	/* Valid URIs according to RFC 3986
	 * (https://www.ietf.org/rfc/rfc3986.txt)
	 * must only contain reserved characters :/?#[]@!$&'()*+,;=
	 * and unreserved characters A-Z a-z 0-9 and -._~
	 * and % encoded symbols.
	 */
	for (i = 0; uri[i] != 0; i++) {
		if (uri[i] < 33) {
			/* control characters and spaces are invalid */
			return 0;
		}
		/* Allow everything else here (See #894) */
	}

	/* A relative uri starts with a / character */
	if (uri[0] == '/') {
		/* relative uri */
		return 2;
	}

	/* It could be an absolute uri: */
	/* This function only checks if the uri is valid, not if it is
	 * addressing the current server. So civetweb can also be used
	 * as a proxy server. */
	for (i = 0; abs_uri_protocols[i].proto != NULL; i++) {
		if (mg_strncasecmp(uri,
		                   abs_uri_protocols[i].proto,
		                   abs_uri_protocols[i].proto_len)
		    == 0) {

			hostend = strchr(uri + abs_uri_protocols[i].proto_len, '/');
			if (!hostend) {
				return 0;
			}
			portbegin = strchr(uri + abs_uri_protocols[i].proto_len, ':');
			if (!portbegin) {
				return 3;
			}

			port = strtoul(portbegin + 1, &portend, 10);
			if ((portend != hostend) || (port <= 0) || !is_valid_port(port)) {
				return 0;
			}

			return 4;
		}
	}

	return 0;
}